

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

void __thiscall
JsUtil::
BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
::Resize(BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
         *this)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  undefined8 *puVar1;
  undefined8 uVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  BOOL BVar6;
  hash_t hVar7;
  undefined4 *puVar8;
  HashedEntry<JsUtil::CharacterBuffer<char16_t>,_Symbol_*> *dst;
  uint uVar9;
  Type pHVar10;
  int iVar11;
  long lVar12;
  size_t requestedBytes;
  long lVar13;
  undefined8 local_60;
  undefined4 local_58;
  uint local_4c;
  int *local_48;
  int *newBuckets;
  int modIndex;
  EntryType *newEntries;
  
  uVar9 = this->count * 2;
  newBuckets._0_4_ = 0x4b;
  uVar5 = 4;
  if (8 < uVar9) {
    uVar5 = this->count & 0x7fffffff;
  }
  uVar5 = PrimePolicy::GetPrime(uVar5,(int *)&newBuckets);
  local_48 = (Type)0x0;
  _modIndex = (Type)0x0;
  if (uVar5 == this->bucketCount) {
    if (uVar9 == 0) {
      dst = (HashedEntry<JsUtil::CharacterBuffer<char16_t>,_Symbol_*> *)&DAT_00000008;
    }
    else {
      this_00 = &this->alloc->
                 super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      requestedBytes = 0xffffffffffffffff;
      if (-1 < (int)uVar9) {
        requestedBytes = (ulong)uVar9 << 4;
      }
      BVar6 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar6 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar4) goto LAB_008a1927;
        *puVar8 = 0;
      }
      dst = (HashedEntry<JsUtil::CharacterBuffer<char16_t>,_Symbol_*> *)
            Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
            AllocInternal(this_00,requestedBytes);
      memset(dst,0,requestedBytes);
      memset(&(dst->
              super_CacheHashedEntry<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
              ).field_0x0 + requestedBytes,0,
             (requestedBytes + 0xf & 0xfffffffffffffff0) - requestedBytes);
      if (dst == (HashedEntry<JsUtil::CharacterBuffer<char16_t>,_Symbol_*> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar4) {
LAB_008a1927:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar8 = 0;
        dst = (HashedEntry<JsUtil::CharacterBuffer<char16_t>,_Symbol_*> *)0x0;
      }
    }
    _modIndex = dst;
    Memory::
    CopyArray<JsUtil::HashedEntry<JsUtil::CharacterBuffer<char16_t>,Symbol*>,Symbol*,Memory::ArenaAllocator>
              (dst,(long)(int)uVar9,this->entries,(long)this->count);
    DeleteEntries(this,this->entries,this->size);
    this->entries = _modIndex;
    this->size = uVar9;
    this->modFunctionIndex = (Type)newBuckets;
  }
  else {
    newBuckets._4_4_ = uVar5;
    Allocate(this,&local_48,(EntryType **)&modIndex,uVar5,uVar9);
    local_4c = uVar9;
    Memory::
    CopyArray<JsUtil::HashedEntry<JsUtil::CharacterBuffer<char16_t>,Symbol*>,Symbol*,Memory::ArenaAllocator>
              (_modIndex,(long)(int)uVar9,this->entries,(long)this->count);
    this->modFunctionIndex = (Type)newBuckets;
    iVar11 = this->count;
    if (0 < iVar11) {
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      lVar12 = 0;
      lVar13 = 0;
      pHVar10 = _modIndex;
      do {
        if (-2 < *(int *)(&(pHVar10->
                           super_CacheHashedEntry<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                           ).field_0x8 + lVar12)) {
          puVar1 = *(undefined8 **)
                    (&(pHVar10->
                      super_CacheHashedEntry<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                      ).field_0x0 + lVar12);
          uVar2 = *puVar1;
          Memory::Recycler::WBSetBit((char *)&local_60);
          local_60 = uVar2;
          Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_60);
          local_58 = *(undefined4 *)(puVar1 + 1);
          hVar7 = CharacterBuffer::operator_cast_to_unsigned_int((CharacterBuffer *)&local_60);
          uVar9 = hVar7 * 2 + 1;
          if (uVar9 != *(uint *)((long)&(pHVar10->
                                        super_CacheHashedEntry<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                                        ).hashCode + lVar12)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar8 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DictionaryEntry.h"
                               ,0xce,
                               "(((static_cast<hash_t>(Comparer::GetHashCode(this->Key())) << 1) | 1) == this->hashCode)"
                               ,"TAGHASH(Comparer::GetHashCode(this->Key())) == this->hashCode");
            if (!bVar4) goto LAB_008a1927;
            *puVar8 = 0;
            uVar9 = *(uint *)((long)&(pHVar10->
                                     super_CacheHashedEntry<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                                     ).hashCode + lVar12);
          }
          hVar7 = PrimePolicy::ModPrime(uVar9 >> 1,newBuckets._4_4_,this->modFunctionIndex);
          *(int *)(&(_modIndex->
                    super_CacheHashedEntry<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                    ).field_0x8 + lVar12) = local_48[(int)hVar7];
          local_48[(int)hVar7] = (int)lVar13;
          iVar11 = this->count;
          pHVar10 = _modIndex;
        }
        lVar13 = lVar13 + 1;
        lVar12 = lVar12 + 0x10;
      } while (lVar13 < iVar11);
    }
    DeleteBuckets(this,this->buckets,this->bucketCount);
    DeleteEntries(this,this->entries,this->size);
    uVar9 = local_4c;
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Resize(this->stats,local_4c,local_4c - this->size);
    }
    this->buckets = local_48;
    this->entries = _modIndex;
    this->bucketCount = newBuckets._4_4_;
    this->size = uVar9;
  }
  return;
}

Assistant:

void Resize()
        {
            AutoDoResize autoDoResize(*this);

            int newSize = SizePolicy::GetNextSize(count);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint newBucketCount = SizePolicy::GetBucketSize(newSize, &modIndex);

            __analysis_assume(newSize > count);
            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            if (newBucketCount == bucketCount)
            {
                // no need to rehash
                newEntries = AllocateEntries(newSize);
                CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                    newEntries, newSize, entries, count);

                DeleteEntries(entries, size);

                this->entries = newEntries;
                this->size = newSize;
                this->modFunctionIndex = modIndex;
                return;
            }

            Allocate(&newBuckets, &newEntries, newBucketCount, newSize);
            CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                newEntries, newSize, entries, count);

            // When TAllocator is of type Recycler, it is possible that the Allocate above causes a collection, which
            // in turn can cause entries in the dictionary to be removed - i.e. the dictionary contains weak references
            // that remove themselves when no longer valid. This means the free list might not be empty anymore.
            this->modFunctionIndex = modIndex;
            for (int i = 0; i < count; i++)
            {
                __analysis_assume(i < newSize);

                if (!IsFreeEntry(newEntries[i]))
                {
                    hash_t hashCode = newEntries[i].template GetHashCode<Comparer<TKey>>();
                    int bucket = GetBucket(hashCode, newBucketCount, modFunctionIndex);
                    newEntries[i].next = newBuckets[bucket];
                    newBuckets[bucket] = i;
                }
            }

            DeleteBuckets(buckets, bucketCount);
            DeleteEntries(entries, size);

#if PROFILE_DICTIONARY
            if (stats)
                stats->Resize(newSize, /*emptyBuckets=*/ newSize - size);
#endif
            this->buckets = newBuckets;
            this->entries = newEntries;
            bucketCount = newBucketCount;
            size = newSize;
        }